

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg2.hpp
# Opt level: O0

void __thiscall trng::mrg2::jump2(mrg2 *this,uint s)

{
  uint in_ESI;
  int32_t *in_RDI;
  result_type d [2];
  result_type r [2];
  uint i;
  result_type c [4];
  result_type b [4];
  int32_t local_4c;
  int32_t local_48;
  int32_t local_44;
  int32_t local_40;
  uint local_3c;
  int32_t local_38 [4];
  int32_t local_28;
  int32_t local_24;
  int32_t local_20;
  int32_t local_1c;
  uint local_c;
  
  local_c = in_ESI;
  memset(local_38,0,0x10);
  local_28 = *in_RDI;
  local_24 = in_RDI[1];
  local_20 = 1;
  local_1c = 0;
  for (local_3c = 0; local_3c < local_c; local_3c = local_3c + 1) {
    int_math::matrix_mult<2>
              ((int32_t (*) [4])&local_28,(int32_t (*) [4])&local_28,&local_38,0x7fffffff);
    local_3c = local_3c + 1;
    if (local_c <= local_3c) break;
    int_math::matrix_mult<2>(&local_38,&local_38,(int32_t (*) [4])&local_28,0x7fffffff);
  }
  local_44 = in_RDI[2];
  local_40 = in_RDI[3];
  if ((local_c & 1) == 0) {
    int_math::matrix_vec_mult<2>
              ((int32_t (*) [4])&local_28,(int32_t (*) [2])&local_44,(int32_t (*) [2])&local_4c,
               0x7fffffff);
  }
  else {
    int_math::matrix_vec_mult<2>
              (&local_38,(int32_t (*) [2])&local_44,(int32_t (*) [2])&local_4c,0x7fffffff);
  }
  in_RDI[2] = local_4c;
  in_RDI[3] = local_48;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg2::jump2(unsigned int s) {
    result_type b[4], c[4]{};
    b[0] = P.a[0];
    b[1] = P.a[1];
    b[2] = 1;
    b[3] = 0;
    for (unsigned int i{0}; i < s; ++i) {
      int_math::matrix_mult<2>(b, b, c, modulus);
      ++i;
      if (not(i < s))
        break;
      int_math::matrix_mult<2>(c, c, b, modulus);
    }
    const result_type r[2]{S.r[0], S.r[1]};
    result_type d[2];
    if ((s & 1u) == 0)
      int_math::matrix_vec_mult<2>(b, r, d, modulus);
    else
      int_math::matrix_vec_mult<2>(c, r, d, modulus);
    S.r[0] = d[0];
    S.r[1] = d[1];
  }